

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * __thiscall
Lowerer::GetForInEnumeratorFieldOpnd
          (Lowerer *this,Opnd *forInEnumeratorOpnd,uint fieldOffset,IRType type)

{
  code *pcVar1;
  OpndKind OVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  StackSym *sym;
  SymOpnd *pSVar6;
  IndirOpnd *pIVar7;
  
  OVar2 = IR::Opnd::GetKind(forInEnumeratorOpnd);
  OVar3 = IR::Opnd::GetKind(forInEnumeratorOpnd);
  if (OVar2 != OpndKindSym) {
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2704,"(forInEnumeratorOpnd->IsIndirOpnd())",
                         "forInEnumeratorOpnd->IsIndirOpnd()");
      if (!bVar4) goto LAB_005d2b69;
      *puVar5 = 0;
    }
    OVar2 = IR::Opnd::GetKind(forInEnumeratorOpnd);
    if (OVar2 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar4) goto LAB_005d2b69;
      *puVar5 = 0;
    }
    pIVar7 = IR::IndirOpnd::New((RegOpnd *)forInEnumeratorOpnd[1]._vptr_Opnd,
                                fieldOffset + *(int *)&forInEnumeratorOpnd[2]._vptr_Opnd,type,
                                this->m_func,false);
    return &pIVar7->super_Opnd;
  }
  if (OVar3 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) {
LAB_005d2b69:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  sym = IR::Opnd::GetStackSym(forInEnumeratorOpnd);
  pSVar6 = IR::SymOpnd::New(&sym->super_Sym,
                            fieldOffset + *(int *)&forInEnumeratorOpnd[1].m_valueType,type,
                            this->m_func);
  return &pSVar6->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::GetForInEnumeratorFieldOpnd(IR::Opnd * forInEnumeratorOpnd, uint fieldOffset, IRType type)
{
    if (forInEnumeratorOpnd->IsSymOpnd())
    {
        IR::SymOpnd * symOpnd = forInEnumeratorOpnd->AsSymOpnd();
        return IR::SymOpnd::New(symOpnd->GetStackSym(), symOpnd->m_offset + fieldOffset, type, this->m_func);
    }
    Assert(forInEnumeratorOpnd->IsIndirOpnd());
    IR::IndirOpnd * indirOpnd = forInEnumeratorOpnd->AsIndirOpnd();
    return IR::IndirOpnd::New(indirOpnd->GetBaseOpnd(), indirOpnd->GetOffset() + fieldOffset, type, this->m_func);
}